

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

Loop * __thiscall
spvtools::opt::LoopUtils::CloneLoop
          (LoopUtils *this,LoopCloningResult *cloning_result,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *ordered_loop_blocks)

{
  IRContext *this_00;
  BasicBlock *pBVar1;
  BasicBlock *pBVar2;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> uVar3;
  bool bVar4;
  uint32_t uVar5;
  CFG *this_01;
  reference ppBVar6;
  mapped_type *ppBVar7;
  mapped_type *pmVar8;
  mapped_type *ppIVar9;
  reference this_02;
  pointer block;
  Instruction *pIVar10;
  pointer pLVar11;
  anon_class_8_1_94218760 local_108;
  function<void_(unsigned_int_*)> local_100;
  Instruction *local_e0;
  Instruction *insn;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *bb;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *bb_ref;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *__range2_1;
  Instruction *local_90;
  undefined1 local_88 [16];
  iterator old_inst;
  iterator new_inst;
  uint32_t local_68;
  uint32_t local_64;
  BasicBlock *local_60;
  BasicBlock *new_bb;
  BasicBlock *old_bb;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  CFG *cfg;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> new_loop;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *ordered_loop_blocks_local;
  LoopCloningResult *cloning_result_local;
  LoopUtils *this_local;
  
  new_loop._M_t.
  super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
  super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>)
       IRContext::get_def_use_mgr(this->context_);
  MakeUnique<spvtools::opt::Loop,spvtools::opt::IRContext*const&>((spvtools *)&cfg,&this->context_);
  this_01 = IRContext::cfg(this->context_);
  __end2 = std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
           begin(ordered_loop_blocks);
  old_bb = (BasicBlock *)
           std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
           end(ordered_loop_blocks);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                                     *)&old_bb), bVar4) {
    ppBVar6 = __gnu_cxx::
              __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
              ::operator*(&__end2);
    new_bb = *ppBVar6;
    local_60 = BasicBlock::Clone(new_bb,this->context_);
    BasicBlock::SetParent(local_60,this->function_);
    pIVar10 = BasicBlock::GetLabelInst(local_60);
    uVar5 = IRContext::TakeNextId(this->context_);
    Instruction::SetResultId(pIVar10,uVar5);
    uVar3 = new_loop;
    pIVar10 = BasicBlock::GetLabelInst(local_60);
    analysis::DefUseManager::AnalyzeInstDef
              ((DefUseManager *)
               uVar3._M_t.
               super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
               .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,pIVar10);
    this_00 = this->context_;
    pIVar10 = BasicBlock::GetLabelInst(local_60);
    IRContext::set_instr_block(this_00,pIVar10,local_60);
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::emplace_back<spvtools::opt::BasicBlock*&>
              ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                *)&cloning_result->cloned_bb_,&local_60);
    pBVar1 = local_60;
    local_64 = BasicBlock::id(new_bb);
    ppBVar7 = std::
              unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
              ::operator[](&cloning_result->old_to_new_bb_,&local_64);
    pBVar2 = new_bb;
    *ppBVar7 = pBVar1;
    local_68 = BasicBlock::id(local_60);
    ppBVar7 = std::
              unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
              ::operator[](&cloning_result->new_to_old_bb_,&local_68);
    *ppBVar7 = pBVar2;
    uVar5 = BasicBlock::id(local_60);
    new_inst.super_iterator.node_._4_4_ = BasicBlock::id(new_bb);
    pmVar8 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&cloning_result->value_map_,
                          (key_type *)((long)&new_inst.super_iterator.node_ + 4));
    *pmVar8 = uVar5;
    bVar4 = Loop::IsInsideLoop(this->loop_,new_bb);
    if (bVar4) {
      pLVar11 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
                operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                            *)&cfg);
      Loop::AddBasicBlock(pLVar11,local_60);
    }
    BasicBlock::begin((BasicBlock *)&old_inst);
    BasicBlock::begin((BasicBlock *)(local_88 + 8));
    while( true ) {
      BasicBlock::end((BasicBlock *)local_88);
      bVar4 = utils::operator!=(&old_inst.super_iterator,
                                (iterator_template<spvtools::opt::Instruction> *)local_88);
      if (!bVar4) break;
      pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*
                          ((iterator_template<spvtools::opt::Instruction> *)(local_88 + 8));
      local_90 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&old_inst.super_iterator);
      ppIVar9 = std::
                unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                ::operator[](&cloning_result->ptr_map_,&local_90);
      *ppIVar9 = pIVar10;
      pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator->(&old_inst.super_iterator);
      bVar4 = Instruction::HasResultId(pIVar10);
      if (bVar4) {
        pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator->
                            (&old_inst.super_iterator);
        uVar5 = IRContext::TakeNextId(this->context_);
        Instruction::SetResultId(pIVar10,uVar5);
        pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator->
                            (&old_inst.super_iterator);
        uVar5 = Instruction::result_id(pIVar10);
        pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator->
                            ((iterator_template<spvtools::opt::Instruction> *)(local_88 + 8));
        __range2_1._4_4_ = Instruction::result_id(pIVar10);
        pmVar8 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&cloning_result->value_map_,(key_type *)((long)&__range2_1 + 4));
        uVar3 = new_loop;
        *pmVar8 = uVar5;
        pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&old_inst.super_iterator)
        ;
        analysis::DefUseManager::AnalyzeInstDef
                  ((DefUseManager *)
                   uVar3._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                   .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,pIVar10);
      }
      InstructionList::iterator::operator++(&old_inst);
      InstructionList::iterator::operator++((iterator *)(local_88 + 8));
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ::begin(&cloning_result->cloned_bb_);
  bb_ref = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::end(&cloning_result->cloned_bb_);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                             *)&bb_ref), bVar4) {
    this_02 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
              ::operator*(&__end2_1);
    block = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            get(this_02);
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&insn);
    while (bVar4 = utils::operator!=(&__end3.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&insn), bVar4)
    {
      pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      local_108.cloning_result = cloning_result;
      local_e0 = pIVar10;
      std::function<void(unsigned_int*)>::
      function<spvtools::opt::LoopUtils::CloneLoop(spvtools::opt::LoopUtils::LoopCloningResult*,std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const&)const::__0,void>
                ((function<void(unsigned_int*)> *)&local_100,&local_108);
      Instruction::ForEachInId(pIVar10,&local_100);
      std::function<void_(unsigned_int_*)>::~function(&local_100);
      analysis::DefUseManager::AnalyzeInstUse
                ((DefUseManager *)
                 new_loop._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                 .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,local_e0);
      IRContext::set_instr_block(this->context_,local_e0,block);
      InstructionList::iterator::operator++(&__end3);
    }
    CFG::RegisterBlock(this_01,block);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
    ::operator++(&__end2_1);
  }
  pLVar11 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::get
                      ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&cfg);
  PopulateLoopNest(this,pLVar11,cloning_result);
  pLVar11 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::release
                      ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&cfg);
  std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
            ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)&cfg);
  return pLVar11;
}

Assistant:

Loop* LoopUtils::CloneLoop(
    LoopCloningResult* cloning_result,
    const std::vector<BasicBlock*>& ordered_loop_blocks) const {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  std::unique_ptr<Loop> new_loop = MakeUnique<Loop>(context_);

  CFG& cfg = *context_->cfg();

  // Clone and place blocks in a SPIR-V compliant order (dominators first).
  for (BasicBlock* old_bb : ordered_loop_blocks) {
    // For each basic block in the loop, we clone it and register the mapping
    // between old and new ids.
    BasicBlock* new_bb = old_bb->Clone(context_);
    new_bb->SetParent(&function_);
    // TODO(1841): Handle id overflow.
    new_bb->GetLabelInst()->SetResultId(context_->TakeNextId());
    def_use_mgr->AnalyzeInstDef(new_bb->GetLabelInst());
    context_->set_instr_block(new_bb->GetLabelInst(), new_bb);
    cloning_result->cloned_bb_.emplace_back(new_bb);

    cloning_result->old_to_new_bb_[old_bb->id()] = new_bb;
    cloning_result->new_to_old_bb_[new_bb->id()] = old_bb;
    cloning_result->value_map_[old_bb->id()] = new_bb->id();

    if (loop_->IsInsideLoop(old_bb)) new_loop->AddBasicBlock(new_bb);

    for (auto new_inst = new_bb->begin(), old_inst = old_bb->begin();
         new_inst != new_bb->end(); ++new_inst, ++old_inst) {
      cloning_result->ptr_map_[&*new_inst] = &*old_inst;
      if (new_inst->HasResultId()) {
        // TODO(1841): Handle id overflow.
        new_inst->SetResultId(context_->TakeNextId());
        cloning_result->value_map_[old_inst->result_id()] =
            new_inst->result_id();

        // Only look at the defs for now, uses are not updated yet.
        def_use_mgr->AnalyzeInstDef(&*new_inst);
      }
    }
  }

  // All instructions (including all labels) have been cloned,
  // remap instruction operands id with the new ones.
  for (std::unique_ptr<BasicBlock>& bb_ref : cloning_result->cloned_bb_) {
    BasicBlock* bb = bb_ref.get();

    for (Instruction& insn : *bb) {
      insn.ForEachInId([cloning_result](uint32_t* old_id) {
        // If the operand is defined in the loop, remap the id.
        auto id_it = cloning_result->value_map_.find(*old_id);
        if (id_it != cloning_result->value_map_.end()) {
          *old_id = id_it->second;
        }
      });
      // Only look at what the instruction uses. All defs are register, so all
      // should be fine now.
      def_use_mgr->AnalyzeInstUse(&insn);
      context_->set_instr_block(&insn, bb);
    }
    cfg.RegisterBlock(bb);
  }

  PopulateLoopNest(new_loop.get(), *cloning_result);

  return new_loop.release();
}